

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mm_convert_card_mtr2_to_mtr1.c
# Opt level: O0

int main(int argc,char **argv)

{
  int iVar1;
  void *__ptr;
  void *__ptr_00;
  FILE *pFVar2;
  size_t sVar3;
  card_entry_mtr1_t *pcard_mtr1;
  card_entry_t *pcard_mtr2;
  dlog_mt_card_table_mtr1_t *pcard_table_mtr1;
  dlog_mt_card_table_t *pcard_table_mtr2;
  int ret;
  int index;
  FILE *ostream;
  FILE *instream;
  char **argv_local;
  int argc_local;
  
  pcard_table_mtr2._0_4_ = 0;
  if (argc < 3) {
    printf("Usage:\n\tmm_convert_card_mtr2_to_mtr1 mm_table_%x.bin mm_table_16.bin\n",0x86);
    argv_local._4_4_ = -1;
  }
  else {
    printf("Nortel Millennium Credit Card Table MTR 2 to MTR1 Converter\n\n");
    __ptr = calloc(1,0x480);
    if (__ptr == (void *)0x0) {
      printf("Failed to allocate %zu bytes.\n",0x480);
      argv_local._4_4_ = -0xc;
    }
    else {
      __ptr_00 = calloc(1,0x294);
      if (__ptr_00 == (void *)0x0) {
        printf("Failed to allocate %zu bytes.\n",0x294);
        free(__ptr);
        argv_local._4_4_ = -0xc;
      }
      else {
        pFVar2 = fopen(argv[1],"rb");
        if (pFVar2 == (FILE *)0x0) {
          printf("Error opening %s\n",argv[1]);
          free(__ptr);
          free(__ptr_00);
          argv_local._4_4_ = -2;
        }
        else {
          iVar1 = mm_validate_table_fsize(0x86,(FILE *)pFVar2,0x480);
          if (iVar1 == 0) {
            sVar3 = fread(__ptr,0x480,1,pFVar2);
            if (sVar3 == 1) {
              for (pcard_table_mtr2._4_4_ = 0; pcard_table_mtr2._4_4_ < 0x14;
                  pcard_table_mtr2._4_4_ = pcard_table_mtr2._4_4_ + 1) {
                memcpy((void *)((long)__ptr_00 + (long)pcard_table_mtr2._4_4_ * 0x21),
                       (void *)((long)__ptr + (long)pcard_table_mtr2._4_4_ * 0x24),0x21);
              }
              pFVar2 = fopen(argv[2],"wb");
              if (pFVar2 == (FILE *)0x0) {
                printf("Error opening output file %s for write.\n",argv[2]);
                argv_local._4_4_ = -2;
              }
              else {
                printf("\nWriting new table to %s\n",argv[2]);
                sVar3 = fwrite(__ptr_00,0x294,1,pFVar2);
                if (sVar3 != 1) {
                  printf("Error writing output file %s\n",argv[2]);
                  pcard_table_mtr2._0_4_ = -5;
                }
                fclose(pFVar2);
                free(__ptr);
                free(__ptr_00);
                argv_local._4_4_ = (int)pcard_table_mtr2;
              }
            }
            else {
              printf("Error reading MTR 2 CCARD table.\n");
              free(__ptr);
              free(__ptr_00);
              fclose(pFVar2);
              argv_local._4_4_ = -5;
            }
          }
          else {
            free(__ptr);
            free(__ptr_00);
            fclose(pFVar2);
            argv_local._4_4_ = -5;
          }
        }
      }
    }
  }
  return argv_local._4_4_;
}

Assistant:

int main(int argc, char *argv[]) {
    FILE *instream;
    FILE *ostream = NULL;
    int   index;
    int   ret = 0;

    dlog_mt_card_table_t* pcard_table_mtr2;
    dlog_mt_card_table_mtr1_t *pcard_table_mtr1;

    if (argc <= 2) {
        printf("Usage:\n" \
               "\tmm_convert_card_mtr2_to_mtr1 mm_table_%x.bin mm_table_16.bin\n", TABLE_ID);
        return -1;
    }

    printf("Nortel Millennium Credit Card Table MTR 2 to MTR1 Converter\n\n");

    pcard_table_mtr2 = (dlog_mt_card_table_t*)calloc(1, sizeof(dlog_mt_card_table_t));

    if (pcard_table_mtr2 == NULL) {
        printf("Failed to allocate %zu bytes.\n", sizeof(dlog_mt_card_table_t));
        return -ENOMEM;
    }

    pcard_table_mtr1 = (dlog_mt_card_table_mtr1_t*)calloc(1, sizeof(dlog_mt_card_table_mtr1_t));

    if (pcard_table_mtr1 == NULL) {
        printf("Failed to allocate %zu bytes.\n", sizeof(dlog_mt_card_table_mtr1_t));
        free(pcard_table_mtr2);
        return -ENOMEM;
    }

    if ((instream = fopen(argv[1], "rb")) == NULL) {
        printf("Error opening %s\n", argv[1]);
        free(pcard_table_mtr2);
        free(pcard_table_mtr1);
        return -ENOENT;
    }

    if (mm_validate_table_fsize(TABLE_ID, instream, sizeof(dlog_mt_card_table_t)) != 0) {
        free(pcard_table_mtr2);
        free(pcard_table_mtr1);
        fclose(instream);
        return -EIO;
    }

    if (fread(pcard_table_mtr2, sizeof(dlog_mt_card_table_t), 1, instream) != 1) {
        printf("Error reading MTR 2 CCARD table.\n");
        free(pcard_table_mtr2);
        free(pcard_table_mtr1);
        fclose(instream);
        return -EIO;
    }

    for (index = 0; index < CCARD_MAX_MTR1; index++) {
        card_entry_t *pcard_mtr2 = &pcard_table_mtr2->c[index];
        card_entry_mtr1_t *pcard_mtr1 = &pcard_table_mtr1->c[index];

        /* Copy the card entry */
        memcpy(pcard_mtr1, pcard_mtr2, sizeof(card_entry_mtr1_t));
    }

    if ((ostream = fopen(argv[2], "wb")) == NULL) {
        printf("Error opening output file %s for write.\n", argv[2]);
        return -ENOENT;
    }

    printf("\nWriting new table to %s\n", argv[2]);

    if (fwrite(pcard_table_mtr1, sizeof(dlog_mt_card_table_mtr1_t), 1, ostream) != 1) {
        printf("Error writing output file %s\n", argv[2]);
        ret = -EIO;
    }

    fclose(ostream);
    free(pcard_table_mtr2);
    free(pcard_table_mtr1);

    return ret;
}